

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O1

bool ON_ChangeRationalNurbsCurveEndWeights
               (int dim,int order,int cv_count,int cvstride,double *cv,double *knot,double w0,
               double w1)

{
  int cv_dim;
  double dVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  
  bVar3 = ON_IsValid(w0);
  if (bVar3) {
    bVar3 = ON_IsValid(w1);
    if ((w1 == 0.0) && (!NAN(w1))) {
      return false;
    }
    if ((w0 == 0.0) && (!NAN(w0))) {
      return false;
    }
    if (!bVar3) {
      return false;
    }
    if (((0.0 <= w0) || (w1 <= 0.0)) && ((w0 <= 0.0 || (0.0 <= w1)))) {
      cv_dim = dim + 1;
      bVar3 = ON_ClampKnotVector(cv_dim,order,cv_count,cvstride,cv,knot,2);
      if (bVar3) {
        dVar6 = cv[dim];
        iVar4 = (cv_count + -1) * cvstride + dim;
        dVar1 = cv[iVar4];
        bVar3 = ON_IsValid(dVar6);
        if (bVar3) {
          bVar3 = ON_IsValid(dVar1);
          if ((dVar6 == 0.0) && (!NAN(dVar6))) {
            return false;
          }
          if (!bVar3) {
            return false;
          }
          if ((dVar1 == 0.0) && (!NAN(dVar1))) {
            return false;
          }
          if (((0.0 <= dVar6) || (dVar1 <= 0.0)) && ((dVar6 <= 0.0 || (0.0 <= dVar1)))) {
            dVar6 = w0 / dVar6;
            dVar7 = w1 / dVar1;
            if (ABS(dVar6 - dVar7) <= ABS(dVar7) * 1.490116119385e-08) {
              dVar7 = (double)(~-(ulong)(dVar6 != dVar7) & (ulong)dVar7 |
                              (ulong)((dVar6 + dVar7) * 0.5) & -(ulong)(dVar6 != dVar7));
              dVar6 = dVar7;
            }
            if ((dVar7 != 1.0) || (NAN(dVar7))) {
              if ((dVar1 != w1) || (NAN(dVar1) || NAN(w1))) {
                if (cv_count != 0) {
                  iVar2 = cv_dim;
                  iVar5 = cv_count;
                  do {
                    for (; iVar2 != 0; iVar2 = iVar2 + -1) {
                      *cv = *cv * dVar7;
                      cv = cv + 1;
                    }
                    cv = cv + (cvstride - cv_dim);
                    iVar5 = iVar5 + -1;
                    iVar2 = cv_dim;
                  } while (iVar5 != 0);
                }
                cv = cv + -(long)(cvstride * cv_count);
              }
            }
            if ((dVar6 != dVar7) || (NAN(dVar6) || NAN(dVar7))) {
              dVar6 = cv[dim];
              dVar1 = cv[iVar4];
              bVar3 = ON_IsValid(dVar6);
              if (bVar3) {
                bVar3 = ON_IsValid(dVar1);
                if (((dVar6 != 0.0) || (NAN(dVar6))) && (bVar3)) {
                  dVar6 = pow(w0 / dVar6,1.0 / (double)(order + -1));
                  bVar3 = ON_IsValid(dVar6);
                  if (!bVar3) {
                    return false;
                  }
                  bVar3 = ON_ReparameterizeRationalNurbsCurve
                                    (dVar6,dim,order,cv_count,cvstride,cv,knot);
                  if (!bVar3) {
                    return false;
                  }
                }
              }
            }
            cv[dim] = w0;
            cv[iVar4] = w1;
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_ChangeRationalNurbsCurveEndWeights(
          int dim, 
          int order, 
          int cv_count,
          int cvstride, 
          double* cv, 
          double* knot,
          double w0, 
          double w1
          )
{
  double r, s, v0, v1;
  int i, j;

  if ( !ON_IsValid(w0) || !ON_IsValid(w1) || 0.0 == w0 || 0.0 == w1 )
    return false;
  if ( (w0 < 0.0 && w1 > 0.0) || (w0 > 0.0 && w1 < 0.0) )
    return false;

  if ( !ON_ClampKnotVector( dim+1, order, cv_count, cvstride, cv, knot, 2 ) )
    return false;

  v0 = cv[dim];
  v1 = cv[cvstride*(cv_count-1)+dim];
  if (!ON_IsValid(v0) || !ON_IsValid(v1) || v0 == 0.0 || v1 == 0.0)
    return false;
  if (v0 < 0.0 && v1 > 0.0)
    return false;
  if ( v0 > 0.0 && v1 < 0.0)
    return false;

  r = w0/v0;
  s = w1/v1;
  if ( fabs(r-s) <= fabs(s)*ON_SQRT_EPSILON )
  {
    // simply scale
    if ( r != s )
      s = 0.5*(r+s);
    r = s;
  }

  if ( 1.0 != s && v1 != w1 )
  {
    // scale to get last weight set to w1
    dim++;
    cvstride -= dim;
    i = cv_count;
    while(i--)
    {
      j = dim;
      while(j--)
        *cv++ *= s;
      cv += cvstride;
    }
    cvstride += dim;
    dim--;
    cv -= cvstride*cv_count;
  }

  if ( r != s )
  {
    v0 = cv[dim];
    v1 = cv[cvstride*(cv_count-1)+dim];
    if ( ON_IsValid(v0) && ON_IsValid(v1) && 0.0 != v0 )
    {
      // need to scale and reparameterize
      r = pow(w0/v0,1.0/((double)(order-1)));
      if ( !ON_IsValid(r) )
        return false;
      if ( !ON_ReparameterizeRationalNurbsCurve(r,dim,order,cv_count,cvstride,cv,knot) )
        return false;
    }
  }

  // make sure weights agree to the last bit! 
  cv[dim] = w0;
  cv[cvstride*(cv_count-1)+dim] = w1;

  return true;
}